

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData *
cfd::core::CryptoUtil::EncryptAes256(ByteData *__return_storage_ptr__,ByteData *key,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  CfdException *pCVar4;
  allocator local_ad;
  int ret;
  undefined1 local_a8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  
  sVar2 = ByteData::GetDataSize(key);
  if (sVar2 != 0x20) {
    local_a8._0_8_ = "cfdcore_util.cpp";
    local_a8._8_4_ = 0x240;
    local_a8._16_8_ = "EncryptAes256";
    logger::warn<>((CfdSourceLocation *)local_a8,"wally_aes key size NG.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_a8,"EncryptAes256Cbc key size error.",(allocator *)&output);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_a8);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ByteData::IsEmpty(data);
  if (!bVar1) {
    sVar2 = ByteData::GetDataSize(data);
    sVar3 = ByteData::GetDataSize(data);
    if ((sVar3 & 0xf) != 0) {
      sVar2 = ByteData::GetDataSize(data);
      sVar2 = (sVar2 & 0xfffffffffffffff0) + 0x10;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,sVar2,
               (allocator_type *)local_a8);
    ByteData::GetBytes(&key_data,key);
    ByteData::GetBytes(&value_data,data);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&input,sVar2,
               (allocator_type *)local_a8);
    memcpy(input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,
           value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,
           (long)value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ret = wally_aes(key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                    input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,1,
                    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    if (ret == 0) {
      ByteData::ByteData(__return_storage_ptr__,&output);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&value_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return __return_storage_ptr__;
    }
    local_a8._0_8_ = "cfdcore_util.cpp";
    local_a8._8_4_ = 0x25d;
    local_a8._16_8_ = "EncryptAes256";
    logger::warn<int&>((CfdSourceLocation *)local_a8,"wally_aes NG[{}].",&ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_a8,"EncryptAes256 error.",&local_ad);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_a8);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a8._0_8_ = "cfdcore_util.cpp";
  local_a8._8_4_ = 0x246;
  local_a8._16_8_ = "EncryptAes256";
  logger::warn<>((CfdSourceLocation *)local_a8,"wally_aes data is Empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_a8,"EncryptAes256Cbc data isEmpty.",(allocator *)&output);
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_a8);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::EncryptAes256(const ByteData &key, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc key size error.");
  }

  if (data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "wally_aes data is Empty.");
    throw CfdException(
        kCfdIllegalStateError, "EncryptAes256Cbc data isEmpty.");
  }

  size_t data_size = data.GetDataSize();
  if (data.GetDataSize() % kAesBlockLength != 0) {
    data_size = ((data.GetDataSize() / kAesBlockLength) + 1) * kAesBlockLength;
  }
  std::vector<uint8_t> output(data_size);
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> value_data = data.GetBytes();
  std::vector<uint8_t> input(data_size);
  // To fill the end with 0
  memcpy(
      input.data(), reinterpret_cast<const uint8_t *>(value_data.data()),
      value_data.size());

  // Encrypt data using AES (ECB mode, no padding).
  int ret = wally_aes(
      key_data.data(), key_data.size(), input.data(), input.size(),
      AES_FLAG_ENCRYPT, output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "EncryptAes256 error.");
  }

  return ByteData(output);
}